

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

int rtr_send_error_pdu(rtr_socket *rtr_socket,void *erroneous_pdu,uint32_t erroneous_pdu_len,
                      pdu_error_type error,char *err_text,uint32_t err_text_len)

{
  long lVar1;
  int iVar2;
  undefined1 *pdu;
  ulong __n;
  uint len;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  undefined1 auStack_48 [2];
  undefined2 uStack_46;
  uint uStack_44;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  len = erroneous_pdu_len + err_text_len + 0x10;
  lVar1 = -((ulong)len + 0xf & 0xfffffffffffffff0);
  pdu = auStack_48 + lVar1;
  if ((erroneous_pdu_len < 2) || (*(char *)((long)erroneous_pdu + 1) != '\n')) {
    __n = (ulong)erroneous_pdu_len;
    *pdu = (char)rtr_socket->version;
    auStack_48[lVar1 + 1] = 10;
    *(short *)(auStack_48 + lVar1 + 2) = (short)error;
    *(uint *)(auStack_48 + lVar1 + 4) = len;
    *(uint32_t *)((long)&local_40 + lVar1) = erroneous_pdu_len;
    if (erroneous_pdu_len != 0) {
      local_40 = rtr_socket;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10a42f;
      memcpy((void *)((long)&local_40 + lVar1 + 4),erroneous_pdu,__n);
      rtr_socket = local_40;
    }
    *(uint32_t *)((long)&local_40 + __n + lVar1 + 4) = err_text_len;
    if (err_text_len != 0) {
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10a457;
      memcpy(pdu + __n + 0x10,err_text,(ulong)err_text_len);
    }
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10a465;
    iVar2 = rtr_send_pdu(rtr_socket,pdu,len);
  }
  else {
    iVar2 = 0;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10a3fa;
    lrtr_dbg("RTR Socket: Don\'t send errors for erroneous error PDUs");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  *(code **)((long)&uStack_50 + lVar1) = recv_loop_cleanup;
  __stack_chk_fail();
}

Assistant:

static int rtr_send_error_pdu(const struct rtr_socket *rtr_socket, const void *erroneous_pdu,
			      const uint32_t erroneous_pdu_len, const enum pdu_error_type error, const char *err_text,
			      const uint32_t err_text_len)
{
	struct pdu_error *err_pdu;
	unsigned int msg_size = sizeof(struct pdu_error) + 4 + erroneous_pdu_len + err_text_len;
	uint8_t msg[msg_size];

	// don't send errors for erroneous error PDUs
	if (erroneous_pdu_len >= 2) {
		if (rtr_get_pdu_type(erroneous_pdu) == ERROR) {
			RTR_DBG1("Don't send errors for erroneous error PDUs");
			return RTR_SUCCESS;
		}
	}

	err_pdu = (struct pdu_error *)msg;
	err_pdu->ver = rtr_socket->version;
	err_pdu->type = ERROR;
	err_pdu->error_code = error;
	err_pdu->len = msg_size;

	err_pdu->len_enc_pdu = erroneous_pdu_len;
	if (erroneous_pdu_len > 0)
		memcpy(err_pdu->rest, erroneous_pdu, erroneous_pdu_len);

	*((uint32_t *)(err_pdu->rest + erroneous_pdu_len)) = err_text_len;
	if (err_text_len > 0)
		memcpy(err_pdu->rest + erroneous_pdu_len + 4, err_text, err_text_len);

	return rtr_send_pdu(rtr_socket, msg, msg_size);
}